

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
flatbuffers::python::Keywords_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,python *this,Version *version)

{
  _Rb_tree_header *p_Var1;
  short sVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_4a5;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  allocator<char> local_4a0;
  allocator<char> local_49f;
  allocator<char> local_49e;
  allocator<char> local_49d;
  allocator<char> local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  allocator<char> local_498;
  allocator<char> local_497;
  allocator<char> local_496;
  allocator<char> local_495;
  allocator<char> local_494;
  allocator<char> local_493;
  allocator<char> local_492;
  allocator<char> local_491;
  allocator<char> local_490;
  allocator<char> local_48f;
  allocator<char> local_48e;
  allocator<char> local_48d;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  allocator<char> local_488;
  allocator<char> local_487;
  allocator<char> local_486;
  allocator<char> local_485;
  allocator_type local_484;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_483;
  allocator<char> local_482;
  allocator<char> local_481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  sVar2 = *(short *)this;
  if ((sVar2 == 0) || (sVar2 == 3)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"and",&local_485);
    std::__cxx11::string::string<std::allocator<char>>(local_460,"as",&local_486);
    std::__cxx11::string::string<std::allocator<char>>(local_440,"assert",&local_487);
    std::__cxx11::string::string<std::allocator<char>>(local_420,"async",&local_488);
    std::__cxx11::string::string<std::allocator<char>>(local_400,"await",&local_489);
    std::__cxx11::string::string<std::allocator<char>>(local_3e0,"break",&local_48a);
    std::__cxx11::string::string<std::allocator<char>>(local_3c0,"class",&local_48b);
    std::__cxx11::string::string<std::allocator<char>>(local_3a0,"continue",&local_48c);
    std::__cxx11::string::string<std::allocator<char>>(local_380,"def",&local_48d);
    std::__cxx11::string::string<std::allocator<char>>(local_360,"del",&local_48e);
    std::__cxx11::string::string<std::allocator<char>>(local_340,"elif",&local_48f);
    std::__cxx11::string::string<std::allocator<char>>(local_320,"else",&local_490);
    std::__cxx11::string::string<std::allocator<char>>(local_300,"except",&local_491);
    std::__cxx11::string::string<std::allocator<char>>(local_2e0,"False",&local_492);
    std::__cxx11::string::string<std::allocator<char>>(local_2c0,"finally",&local_493);
    std::__cxx11::string::string<std::allocator<char>>(local_2a0,"for",&local_494);
    std::__cxx11::string::string<std::allocator<char>>(local_280,"from",&local_495);
    std::__cxx11::string::string<std::allocator<char>>(local_260,"global",&local_496);
    std::__cxx11::string::string<std::allocator<char>>(local_240,"if",&local_497);
    std::__cxx11::string::string<std::allocator<char>>(local_220,"import",&local_498);
    std::__cxx11::string::string<std::allocator<char>>(local_200,"in",&local_499);
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,"is",&local_49a);
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,"lambda",&local_49b);
    std::__cxx11::string::string<std::allocator<char>>(local_1a0,"None",&local_49c);
    std::__cxx11::string::string<std::allocator<char>>(local_180,"nonlocal",&local_49d);
    std::__cxx11::string::string<std::allocator<char>>(local_160,"not",&local_49e);
    std::__cxx11::string::string<std::allocator<char>>(local_140,"or",&local_49f);
    std::__cxx11::string::string<std::allocator<char>>(local_120,"pass",&local_4a0);
    std::__cxx11::string::string<std::allocator<char>>(local_100,"raise",&local_4a1);
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"return",&local_4a2);
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"True",&local_4a3);
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"try",(allocator<char> *)&local_4a4)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"while",(allocator<char> *)&local_4a5);
    std::__cxx11::string::string<std::allocator<char>>(local_60,"with",&local_481);
    std::__cxx11::string::string<std::allocator<char>>(local_40,"yield",&local_482);
    __l_00._M_len = 0x23;
    __l_00._M_array = &local_480;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(__return_storage_ptr__,__l_00,&local_483,&local_484);
    lVar3 = 0x440;
    do {
      std::__cxx11::string::~string((string *)((long)&local_480._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
  }
  else if (sVar2 == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"and",&local_485);
    std::__cxx11::string::string<std::allocator<char>>(local_460,"as",&local_486);
    std::__cxx11::string::string<std::allocator<char>>(local_440,"assert",&local_487);
    std::__cxx11::string::string<std::allocator<char>>(local_420,"break",&local_488);
    std::__cxx11::string::string<std::allocator<char>>(local_400,"class",&local_489);
    std::__cxx11::string::string<std::allocator<char>>(local_3e0,"continue",&local_48a);
    std::__cxx11::string::string<std::allocator<char>>(local_3c0,"def",&local_48b);
    std::__cxx11::string::string<std::allocator<char>>(local_3a0,"del",&local_48c);
    std::__cxx11::string::string<std::allocator<char>>(local_380,"elif",&local_48d);
    std::__cxx11::string::string<std::allocator<char>>(local_360,"else",&local_48e);
    std::__cxx11::string::string<std::allocator<char>>(local_340,"except",&local_48f);
    std::__cxx11::string::string<std::allocator<char>>(local_320,"exec",&local_490);
    std::__cxx11::string::string<std::allocator<char>>(local_300,"finally",&local_491);
    std::__cxx11::string::string<std::allocator<char>>(local_2e0,"for",&local_492);
    std::__cxx11::string::string<std::allocator<char>>(local_2c0,"from",&local_493);
    std::__cxx11::string::string<std::allocator<char>>(local_2a0,"global",&local_494);
    std::__cxx11::string::string<std::allocator<char>>(local_280,"if",&local_495);
    std::__cxx11::string::string<std::allocator<char>>(local_260,"import",&local_496);
    std::__cxx11::string::string<std::allocator<char>>(local_240,"in",&local_497);
    std::__cxx11::string::string<std::allocator<char>>(local_220,"is",&local_498);
    std::__cxx11::string::string<std::allocator<char>>(local_200,"lambda",&local_499);
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,"not",&local_49a);
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,"or",&local_49b);
    std::__cxx11::string::string<std::allocator<char>>(local_1a0,"pass",&local_49c);
    std::__cxx11::string::string<std::allocator<char>>(local_180,"print",&local_49d);
    std::__cxx11::string::string<std::allocator<char>>(local_160,"raise",&local_49e);
    std::__cxx11::string::string<std::allocator<char>>(local_140,"return",&local_49f);
    std::__cxx11::string::string<std::allocator<char>>(local_120,"try",&local_4a0);
    std::__cxx11::string::string<std::allocator<char>>(local_100,"while",&local_4a1);
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"with",&local_4a2);
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"yield",&local_4a3);
    __l._M_len = 0x1f;
    __l._M_array = &local_480;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(__return_storage_ptr__,__l,&local_4a4,&local_4a5);
    lVar3 = 0x3c0;
    do {
      std::__cxx11::string::~string((string *)((long)&local_480._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
  }
  else {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> Keywords(const Version &version) {
  switch (version.major) {
    case 2:
      // https://docs.python.org/2/reference/lexical_analysis.html#keywords
      return {
          "and",   "as",     "assert", "break",  "class", "continue", "def",
          "del",   "elif",   "else",   "except", "exec",  "finally",  "for",
          "from",  "global", "if",     "import", "in",    "is",       "lambda",
          "not",   "or",     "pass",   "print",  "raise", "return",   "try",
          "while", "with",   "yield",
      };
    case 0:
    case 3:
      // https://docs.python.org/3/reference/lexical_analysis.html#keywords
      return {
          "and",      "as",       "assert",  "async", "await",  "break",
          "class",    "continue", "def",     "del",   "elif",   "else",
          "except",   "False",    "finally", "for",   "from",   "global",
          "if",       "import",   "in",      "is",    "lambda", "None",
          "nonlocal", "not",      "or",      "pass",  "raise",  "return",
          "True",     "try",      "while",   "with",  "yield",
      };
    default:
      return {};
  }
}